

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MockParameterTest_longAndUnsignedLongWithSameBitRepresentationShouldNotBeTreatedAsEqual_TestShell
::createTest(TEST_MockParameterTest_longAndUnsignedLongWithSameBitRepresentationShouldNotBeTreatedAsEqual_TestShell
             *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
                                  ,0x102);
  TEST_MockParameterTest_longAndUnsignedLongWithSameBitRepresentationShouldNotBeTreatedAsEqual_Test
  ::
  TEST_MockParameterTest_longAndUnsignedLongWithSameBitRepresentationShouldNotBeTreatedAsEqual_Test
            ((TEST_MockParameterTest_longAndUnsignedLongWithSameBitRepresentationShouldNotBeTreatedAsEqual_Test
              *)this_00);
  return this_00;
}

Assistant:

TEST(MockParameterTest, longAndUnsignedLongWithSameBitRepresentationShouldNotBeTreatedAsEqual)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo")->withParameter("parameter", (long)-1);
    MockNamedValue parameter("parameter");
    parameter.setValue((unsigned long)-1);
    MockUnexpectedInputParameterFailure expectedFailure(mockFailureTest(), "foo", parameter, expectations);

    mock().expectOneCall("foo").withParameter("parameter", (long)-1);
    mock().actualCall("foo").withParameter("parameter", (unsigned long)-1);

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}